

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2obj.cpp
# Opt level: O2

void pbrt::defineDefaultMaterials(ofstream *file)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)file,"newmtl pbrt_parser_no_materials_yet");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)file,"Kd .6 .6 .6");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)file,"Ka .1 .1 .1");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)file,"usematerial pbrt_parser_no_materials_yet");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void defineDefaultMaterials(std::ofstream &file)
  {
    file << "newmtl pbrt_parser_no_materials_yet" << std::endl;
    file << "Kd .6 .6 .6" << std::endl;
    file << "Ka .1 .1 .1" << std::endl;
    file << "usematerial pbrt_parser_no_materials_yet" << std::endl << std::endl;
  }